

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activity_tracking.hpp
# Opt level: O1

unique_ptr<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_>_>
 __thiscall
so_5::stats::activity_tracking_stuff::
create_appropriate_disp<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>,so_5::environment_t,so_5::disp::adv_thread_pool::disp_params_t,unsigned_long,so_5::disp::mpmc_queue_traits::queue_params_t_const&>
          (activity_tracking_stuff *this,environment_t *env,disp_params_t *disp_params,
          unsigned_long *args,queue_params_t *args_1)

{
  work_thread_activity_tracking_t wVar1;
  dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
  *this_00;
  pointer *__ptr;
  
  *(undefined8 *)this = 0;
  wVar1 = (disp_params->
          super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::adv_thread_pool::disp_params_t>
          ).m_flag;
  if (wVar1 == unspecified) {
    wVar1 = environment_t::work_thread_activity_tracking(env);
  }
  if (wVar1 == on) {
    this_00 = (dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
               *)operator_new(0x1b8);
    so_5::disp::thread_pool::common_implementation::
    dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
    ::dispatcher_t((dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
                    *)this_00,*args,args_1);
  }
  else {
    this_00 = (dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
               *)operator_new(0x1b8);
    so_5::disp::thread_pool::common_implementation::
    dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
    ::dispatcher_t(this_00,*args,args_1);
  }
  *(dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
    **)this = this_00;
  return (__uniq_ptr_data<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr< COMMON_DISP_IFACE_TYPE >
create_appropriate_disp(
	ENV & env,
	const DISP_PARAMS & disp_params,
	ARGS && ...args )
	{
		std::unique_ptr< COMMON_DISP_IFACE_TYPE > disp;

		auto tracking = disp_params.work_thread_activity_tracking();
		if( work_thread_activity_tracking_t::unspecified == tracking )
			tracking = env.work_thread_activity_tracking();

		if( work_thread_activity_tracking_t::on == tracking )
			disp.reset(
				new DISP_WITH_TRACKING{ std::forward<ARGS>(args)... } );
		else
			disp.reset(
				new DISP_NO_TRACKING{ std::forward<ARGS>(args)... } );

		return disp;
	}